

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O2

void __thiscall pager::pager(pager *this,string *fileName)

{
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::string::string((string *)this,(string *)fileName);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"r+",&local_39);
  r_file::open(&this->_f,(char *)fileName,(int)local_38);
  std::__cxx11::string::~string(local_38);
  map_page_from(&this->_mm,this,0);
  return;
}

Assistant:

pager::pager(const std::string& fileName) :
    _fileName(fileName),
    _f(r_file::open(fileName, "r+")),
    _mm(map_page_from(0))
{
}